

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::dxt_hc::endpoint_indices_details>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  endpoint_indices_details *local_38;
  endpoint_indices_details *pDst;
  endpoint_indices_details *pSrc_end;
  endpoint_indices_details *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  local_38 = (endpoint_indices_details *)pDst_void;
  for (pSrc_end = (endpoint_indices_details *)pSrc_void;
      pSrc_end != (endpoint_indices_details *)((long)pSrc_void + (ulong)num * 8);
      pSrc_end = pSrc_end + 1) {
    *local_38 = *pSrc_end;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }